

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeErrorPrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  RuntimeFunction **ppRVar1;
  JavascriptString *pJVar2;
  PropertyAttributes prototypeNameMessageAttributes;
  bool hasNoEnumerableProperties;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *prototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,4,0);
  this = RecyclableObject::GetLibrary(&prototype->super_RecyclableObject);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorConstructor);
  AddMember(this,prototype,0x67,*ppRVar1);
  pJVar2 = CreateStringFromCppLiteral<6ul>(this,(char16 (*) [6])0x195d70e);
  AddMember(this,prototype,0x106,pJVar2,'\x06');
  pJVar2 = GetEmptyString(this);
  AddMember(this,prototype,0x102,pJVar2,'\x06');
  AddFunctionToLibraryObject
            (this,prototype,0x178,(FunctionInfo *)JavascriptError::EntryInfo::ToString,0,'\x06');
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeErrorPrototype(DynamicObject* prototype, DeferredTypeHandlerBase* typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 4);

        JavascriptLibrary* library = prototype->GetLibrary();

        library->AddMember(prototype, PropertyIds::constructor, library->errorConstructor);

        bool hasNoEnumerableProperties = true;
        PropertyAttributes prototypeNameMessageAttributes = PropertyConfigurable | PropertyWritable;

        library->AddMember(prototype, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Error")), prototypeNameMessageAttributes);
        library->AddMember(prototype, PropertyIds::message, library->GetEmptyString(), prototypeNameMessageAttributes);
        library->AddFunctionToLibraryObject(prototype, PropertyIds::toString, &JavascriptError::EntryInfo::ToString, 0);

        prototype->SetHasNoEnumerableProperties(hasNoEnumerableProperties);

        return true;
    }